

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

size_t google::protobuf::internal::SerialArena::FreeStringBlocks
                 (StringBlock *string_block,size_t unused_bytes)

{
  LogMessage *pLVar1;
  string *psVar2;
  size_t sVar3;
  string *s_1;
  string *__end3;
  string *__begin3;
  StringBlock *__range3;
  size_t deallocated;
  string *s;
  string *end;
  StringBlock *next;
  LogMessage local_40;
  Voidify local_29;
  size_t local_28;
  size_t unused_bytes_local;
  StringBlock *string_block_local;
  string *local_10;
  
  local_28 = unused_bytes;
  unused_bytes_local = (size_t)string_block;
  if (string_block != (StringBlock *)0x0) {
    end = (string *)StringBlock::next(string_block);
    local_10 = end;
    psVar2 = StringBlock::end_abi_cxx11_((StringBlock *)unused_bytes_local);
    for (deallocated = (size_t)StringBlock::AtOffset_abi_cxx11_
                                         ((StringBlock *)unused_bytes_local,local_28);
        (string *)deallocated != psVar2; deallocated = deallocated + 0x20) {
      std::__cxx11::string::~string((string *)deallocated);
    }
    __range3 = (StringBlock *)StringBlock::Delete((StringBlock *)unused_bytes_local);
    while (unused_bytes_local = (size_t)end, end != (string *)0x0) {
      end = (string *)StringBlock::next((StringBlock *)end);
      sVar3 = unused_bytes_local;
      string_block_local = (StringBlock *)end;
      __end3 = StringBlock::begin_abi_cxx11_((StringBlock *)unused_bytes_local);
      psVar2 = StringBlock::end_abi_cxx11_((StringBlock *)sVar3);
      for (; __end3 != psVar2; __end3 = __end3 + 1) {
        std::__cxx11::string::~string((string *)__end3);
      }
      sVar3 = StringBlock::Delete((StringBlock *)unused_bytes_local);
      __range3 = (StringBlock *)((long)&__range3->next_ + sVar3);
    }
    return (size_t)__range3;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
             ,0x16a,"string_block != nullptr");
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar1);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

size_t SerialArena::FreeStringBlocks(StringBlock* string_block,
                                     size_t unused_bytes) {
  ABSL_DCHECK(string_block != nullptr);
  StringBlock* next = string_block->next();
  absl::PrefetchToLocalCacheNta(next);
  std::string* end = string_block->end();
  for (std::string* s = string_block->AtOffset(unused_bytes); s != end; ++s) {
    s->~basic_string();
  }
  size_t deallocated = StringBlock::Delete(string_block);

  while ((string_block = next) != nullptr) {
    next = string_block->next();
    absl::PrefetchToLocalCacheNta(next);
    for (std::string& s : *string_block) {
      s.~basic_string();
    }
    deallocated += StringBlock::Delete(string_block);
  }
  return deallocated;
}